

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenCallingDoubleUniformFunctionsForBooleans
          (GPUShaderFP64Test1 *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  char *local_278;
  MessageBuilder local_270;
  int local_f0;
  GLenum error_code;
  uint local_dc;
  uint local_d8;
  GLint uniform_location;
  uint n_uniform_location;
  _uniform_function uniform_function;
  uint n_uniform_function;
  uint n_uniform_locations;
  GLint uniform_locations [8];
  bool result;
  Functions *gl;
  double double_data [16];
  GPUShaderFP64Test1 *this_local;
  long lVar3;
  
  memcpy(&gl,&DAT_029fcf20,0x80);
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  uniform_locations[7]._3_1_ = 1;
  n_uniform_function = this->m_po_bool_arr_uniform_location;
  n_uniform_locations = this->m_po_bool_uniform_location;
  uniform_locations[0] = this->m_po_bvec2_arr_uniform_location;
  uniform_locations[1] = this->m_po_bvec2_uniform_location;
  uniform_locations[2] = this->m_po_bvec3_arr_uniform_location;
  uniform_locations[3] = this->m_po_bvec3_uniform_location;
  uniform_locations[4] = this->m_po_bvec4_arr_uniform_location;
  uniform_locations[5] = this->m_po_bvec4_uniform_location;
  uniform_function = UNIFORM_FUNCTION_MATRIX2DV;
  for (n_uniform_location = 0; n_uniform_location < 0x11;
      n_uniform_location = n_uniform_location + 1) {
    uniform_location = n_uniform_location;
    for (local_d8 = 0; local_d8 < 8; local_d8 = local_d8 + 1) {
      local_dc = (&n_uniform_function)[local_d8];
      switch(uniform_location) {
      case 0:
        (**(code **)(lVar3 + 0x14d0))(0,local_dc);
        break;
      case 1:
        (**(code **)(lVar3 + 0x14d8))(local_dc,1,&gl);
        break;
      case 2:
        (**(code **)(lVar3 + 0x1510))(0,0x3ff0000000000000,local_dc);
        break;
      case 3:
        (**(code **)(lVar3 + 0x1518))(local_dc,1,&gl);
        break;
      case 4:
        (**(code **)(lVar3 + 0x1550))(0,0x3ff0000000000000,0x4000000000000000,local_dc);
        break;
      case 5:
        (**(code **)(lVar3 + 0x1558))(local_dc,1,&gl);
        break;
      case 6:
        (**(code **)(lVar3 + 0x1590))
                  (0,0x3ff0000000000000,0x4000000000000000,0x4008000000000000,local_dc);
        break;
      case 7:
        (**(code **)(lVar3 + 0x1598))(local_dc,1,&gl);
        break;
      case 8:
        (**(code **)(lVar3 + 0x15d8))(local_dc,1,0,&gl);
        break;
      case 9:
        (**(code **)(lVar3 + 0x15e8))(local_dc,1,0,&gl);
        break;
      case 10:
        (**(code **)(lVar3 + 0x15f8))(local_dc,1,0,&gl);
        break;
      case 0xb:
        (**(code **)(lVar3 + 0x1608))(local_dc,1,0,&gl);
        break;
      case 0xc:
        (**(code **)(lVar3 + 0x1618))(local_dc,1,0,&gl);
        break;
      case 0xd:
        (**(code **)(lVar3 + 0x1628))(local_dc,1,0,&gl);
        break;
      case 0xe:
        (**(code **)(lVar3 + 0x1638))(local_dc,1,0,&gl);
        break;
      case 0xf:
        (**(code **)(lVar3 + 0x1648))(local_dc,1,0,&gl);
        break;
      case 0x10:
        (**(code **)(lVar3 + 0x1658))(local_dc,1,0,&gl);
        break;
      default:
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Unrecognized uniform function",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                   ,0x916);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_f0 = (**(code **)(lVar3 + 0x800))();
      if (local_f0 != 0x502) {
        this_01 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_270,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<(&local_270,(char (*) [10])"Function ");
        local_278 = getUniformFunctionString(this,uniform_location);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_278);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(char (*) [69])
                                   "() did not generate an error when applied against a boolean uniform."
                           );
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_270);
        uniform_locations[7]._3_1_ = 0;
      }
    }
  }
  return (bool)(uniform_locations[7]._3_1_ & 1);
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingDoubleUniformFunctionsForBooleans()
{
	const double double_data[] = {
		1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0, 8.0, 9.0, 10.0, 11.0, 12.0, 13.0, 14.0, 15.0, 16.0
	};
	const glw::Functions& gl				  = m_context.getRenderContext().getFunctions();
	bool				  result			  = true;
	glw::GLint			  uniform_locations[] = { m_po_bool_arr_uniform_location,  m_po_bool_uniform_location,
									   m_po_bvec2_arr_uniform_location, m_po_bvec2_uniform_location,
									   m_po_bvec3_arr_uniform_location, m_po_bvec3_uniform_location,
									   m_po_bvec4_arr_uniform_location, m_po_bvec4_uniform_location };
	const unsigned int n_uniform_locations = sizeof(uniform_locations) / sizeof(uniform_locations[0]);

	for (unsigned int n_uniform_function = UNIFORM_FUNCTION_FIRST; n_uniform_function < UNIFORM_FUNCTION_COUNT;
		 ++n_uniform_function)
	{
		const _uniform_function uniform_function = (_uniform_function)n_uniform_function;

		for (unsigned int n_uniform_location = 0; n_uniform_location < n_uniform_locations; ++n_uniform_location)
		{
			const glw::GLint uniform_location = uniform_locations[n_uniform_location];

			switch (uniform_function)
			{
			case UNIFORM_FUNCTION_1D:
				gl.uniform1d(uniform_location, 0.0);
				break;
			case UNIFORM_FUNCTION_2D:
				gl.uniform2d(uniform_location, 0.0, 1.0);
				break;
			case UNIFORM_FUNCTION_3D:
				gl.uniform3d(uniform_location, 0.0, 1.0, 2.0);
				break;
			case UNIFORM_FUNCTION_4D:
				gl.uniform4d(uniform_location, 0.0, 1.0, 2.0, 3.0);
				break;

			case UNIFORM_FUNCTION_1DV:
				gl.uniform1dv(uniform_location, 1 /* count */, double_data);
				break;
			case UNIFORM_FUNCTION_2DV:
				gl.uniform2dv(uniform_location, 1 /* count */, double_data);
				break;
			case UNIFORM_FUNCTION_3DV:
				gl.uniform3dv(uniform_location, 1 /* count */, double_data);
				break;
			case UNIFORM_FUNCTION_4DV:
				gl.uniform4dv(uniform_location, 1 /* count */, double_data);
				break;

			case UNIFORM_FUNCTION_MATRIX2DV:
				gl.uniformMatrix2dv(uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX2X3DV:
				gl.uniformMatrix2x3dv(uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX2X4DV:
				gl.uniformMatrix2x4dv(uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3DV:
				gl.uniformMatrix3dv(uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3X2DV:
				gl.uniformMatrix3x2dv(uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3X4DV:
				gl.uniformMatrix3x4dv(uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4DV:
				gl.uniformMatrix4dv(uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4X2DV:
				gl.uniformMatrix4x2dv(uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4X3DV:
				gl.uniformMatrix4x3dv(uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
				break;

			default:
			{
				TCU_FAIL("Unrecognized uniform function");
			}
			}

			/* Make sure GL_INVALID_OPERATION was generated by the call */
			const glw::GLenum error_code = gl.getError();

			if (error_code != GL_INVALID_OPERATION)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Function " << getUniformFunctionString(uniform_function)
								   << "() did not generate an error"
									  " when applied against a boolean uniform."
								   << tcu::TestLog::EndMessage;

				result = false;
			}
		} /* for (all bool uniforms) */
	}	 /* for (all uniform functions) */

	return result;
}